

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_list.cpp
# Opt level: O0

double __thiscall ExprEval::Engine::NodeList::calc(NodeList *this,size_t index,size_t direction)

{
  ulong uVar1;
  size_t sVar2;
  int iVar3;
  size_type sVar4;
  Exception *pEVar5;
  reference pvVar6;
  undefined4 extraout_var;
  reference pvVar7;
  size_t sVar8;
  undefined4 extraout_var_00;
  double dVar9;
  string local_408 [32];
  value_type local_3e8 [32];
  ostringstream local_3c8 [8];
  ostringstream tmp;
  ulong local_250;
  size_t i_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args_vec;
  __cxx11 local_228 [32];
  string local_208 [39];
  undefined1 local_1e1;
  __cxx11 local_1e0 [32];
  string local_1c0 [32];
  ulong local_1a0;
  size_t i;
  double args [10];
  undefined1 local_140 [8];
  vector<int,_std::allocator<int>_> positions;
  __cxx11 local_120 [32];
  string local_100 [32];
  CustomOperator *local_e0;
  BaseSpecification *specification;
  double result;
  undefined1 local_c8 [7];
  bool is_standard_opr;
  Node node;
  __cxx11 local_68 [32];
  string local_48 [32];
  size_t local_28;
  size_t direction_local;
  size_t index_local;
  NodeList *this_local;
  
  local_28 = direction;
  direction_local = index;
  index_local = (size_t)this;
  sVar4 = std::vector<ExprEval::Engine::Node,_std::allocator<ExprEval::Engine::Node>_>::size
                    (&this->m_nodes);
  if (sVar4 <= index) {
    node._75_1_ = 1;
    pEVar5 = (Exception *)__cxa_allocate_exception(0x30);
    std::__cxx11::to_string(local_68,direction_local);
    std::operator+((char *)local_48,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"node @ ");
    Exception::Exception(pEVar5,Expr_Logic,local_48);
    node._75_1_ = 0;
    __cxa_throw(pEVar5,&Exception::typeinfo,Exception::~Exception);
  }
  pvVar6 = std::vector<ExprEval::Engine::Node,_std::allocator<ExprEval::Engine::Node>_>::operator[]
                     (&this->m_nodes,direction_local);
  Node::Node((Node *)local_c8,pvVar6);
  result._7_1_ = 1;
  if (local_c8._0_4_ == Number) {
    this_local = (NodeList *)node._0_8_;
    result._0_4_ = 1;
  }
  else if (local_c8._0_4_ == Operator) {
    specification = (BaseSpecification *)0x0;
    local_e0 = (CustomOperator *)Operator::get_specification((string *)&node.number);
    if (local_e0 == (CustomOperator *)0x0) {
      result._7_1_ = 0;
      local_e0 = Operator::get_custom_specification((string *)&node.number);
      if (local_e0 == (CustomOperator *)0x0) {
        positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._7_1_ = 1;
        pEVar5 = (Exception *)__cxa_allocate_exception(0x30);
        std::__cxx11::to_string(local_120,direction_local);
        std::operator+((char *)local_100,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "node @ ");
        Exception::Exception(pEVar5,Symbol_Not_Found,local_100);
        positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._7_1_ = 0;
        __cxa_throw(pEVar5,&Exception::typeinfo,Exception::~Exception);
      }
    }
    (*(local_e0->super_BaseSpecification)._vptr_BaseSpecification[4])(local_140);
    for (local_1a0 = 0; uVar1 = local_1a0,
        iVar3 = (*(local_e0->super_BaseSpecification)._vptr_BaseSpecification[3])(),
        uVar1 < CONCAT44(extraout_var,iVar3); local_1a0 = local_1a0 + 1) {
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_140,local_1a0);
      sVar8 = direction_local;
      if (*pvVar7 < 0) {
        if (local_28 == 1) {
          local_1e1 = 1;
          pEVar5 = (Exception *)__cxa_allocate_exception(0x30);
          std::__cxx11::to_string(local_1e0,direction_local);
          std::operator+((char *)local_1c0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "node @ ");
          Exception::Exception(pEVar5,Expr_Logic,local_1c0);
          local_1e1 = 0;
          __cxa_throw(pEVar5,&Exception::typeinfo,Exception::~Exception);
        }
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_140,local_1a0);
        sVar2 = direction_local;
        if (sVar8 < (ulong)(long)-*pvVar7) {
          args[local_1a0 - 1] = 0.0;
        }
        else {
          this->m_beg = this->m_beg - 1;
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_140,local_1a0);
          dVar9 = calc(this,sVar2 + (long)*pvVar7,0xffffffffffffffff);
          args[local_1a0 - 1] = dVar9;
        }
      }
      else {
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_140,local_1a0);
        sVar8 = direction_local;
        if (0 < *pvVar7) {
          if (local_28 == 0xffffffffffffffff) {
            args_vec.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
            pEVar5 = (Exception *)__cxa_allocate_exception(0x30);
            std::__cxx11::to_string(local_228,direction_local);
            std::operator+((char *)local_208,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           "node @ ");
            Exception::Exception(pEVar5,Expr_Logic,local_208);
            args_vec.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
            __cxa_throw(pEVar5,&Exception::typeinfo,Exception::~Exception);
          }
          this->m_end = this->m_end + 1;
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_140,local_1a0);
          dVar9 = calc(this,sVar8 + (long)*pvVar7,1);
          args[local_1a0 - 1] = dVar9;
        }
      }
    }
    if ((result._7_1_ & 1) == 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&i_1);
      for (local_250 = 0;
          iVar3 = (*(local_e0->super_BaseSpecification)._vptr_BaseSpecification[3])(),
          local_250 < CONCAT44(extraout_var_00,iVar3); local_250 = local_250 + 1) {
        std::__cxx11::ostringstream::ostringstream(local_3c8);
        std::ostream::operator<<((ostream *)local_3c8,args[local_250 - 1]);
        std::__cxx11::ostringstream::str();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&i_1,local_3e8);
        std::__cxx11::string::~string((string *)local_3e8);
        std::__cxx11::ostringstream::~ostringstream(local_3c8);
      }
      (*(local_e0->super_BaseSpecification)._vptr_BaseSpecification[5])(local_408,local_e0,&i_1);
      Node::set(&this->m_cache,local_408,true);
      std::__cxx11::string::~string((string *)local_408);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&i_1);
    }
    else {
      sVar8 = Operator::get_index((string *)&node.number);
      specification = (BaseSpecification *)Operator::trigger(sVar8,(double *)&i);
      (this->m_cache).type = Empty;
    }
    this_local = (NodeList *)specification;
    result._0_4_ = 1;
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_140);
  }
  else {
    this_local = (NodeList *)0x0;
    result._0_4_ = 1;
  }
  Node::~Node((Node *)local_c8);
  return (double)this_local;
}

Assistant:

double NodeList::calc(size_t index, size_t direction){
            if(index >= m_nodes.size()){
                throw Exception(Error::Expr_Logic, "node @ " + std::to_string(index));
            }

            Node node = m_nodes[index];
            bool is_standard_opr = true;

            if(node.type == NodeType::Number){
                return node.number;
            } else if(node.type == NodeType::Operator){
                // std::cout<<"node symbol: "<<node.symbol<<'\n';
                double result = 0.0;
                Operator::BaseSpecification* specification = Operator::get_specification(node.symbol);
                if(!specification){
                    is_standard_opr = false;
                    // printf("standard opr\n");
                    if(!(specification = Operator::get_custom_specification(node.symbol))){
                        // printf("throwing...\n");
                        throw Exception(Error::Symbol_Not_Found, "node @ " + std::to_string(index));
                    }
                }

                auto positions = specification->get_arg_positons();
                double args[10];
                // std::cout<<"index: "<<index<<", list size: "<<size()<<'\n';
                for(size_t i=0; i<specification->get_n_arg(); ++i){
                    if(positions[i] < 0){
                        if(direction == 1){
                            throw Exception(Error::Expr_Logic, "node @ " + std::to_string(index));
                        }

                        if(index >= -positions[i]){
                            m_beg -= 1;
                            args[i] = calc(index+positions[i], -1);
                        } else{
                            args[i] = 0;
                        }
                    } else if(positions[i] > 0){
                        if(direction == -1)
                            throw Exception(Error::Expr_Logic, "node @ " + std::to_string(index));
                        
                        m_end += 1;
                        args[i] = calc(index+positions[i], 1);
                    }
                    // printf("> arg: %lf\n", args[i]);
                }

                if(is_standard_opr){
                    // printf("going with the standart opr...\n");
                    result = Operator::trigger(Operator::get_index(node.symbol), args);
                    m_cache.type = NodeType::Empty;
                } else{
                    std::vector<std::string> args_vec;
                    for(size_t i=0; i<specification->get_n_arg(); ++i){
                        std::ostringstream tmp;
                        tmp<<args[i];
                        args_vec.push_back(tmp.str());
                    }
                    m_cache.set(specification->convert(args_vec));
                    // std::cout<<"cache: "<<m_cache.expression<<'\n';
                }

                return result;
            } else{
                // TO DO
                return 0;
            }
        }